

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

IceTCommunicator icetCreateMPICommunicator(MPI_Comm mpi_comm)

{
  void *pvVar1;
  IceTCommunicator comm;
  MPI_Comm mpi_comm_local;
  
  mpi_comm_local = (MPI_Comm)malloc(0x80);
  if (mpi_comm_local == (MPI_Comm)0x0) {
    icetRaiseDiagnostic("Could not allocate memory for IceTCommunicator.",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0xba);
    mpi_comm_local = (MPI_Comm)0x0;
  }
  else {
    *(code **)mpi_comm_local = Duplicate;
    *(code **)(mpi_comm_local + 8) = Destroy;
    *(code **)(mpi_comm_local + 0x10) = Barrier;
    *(code **)(mpi_comm_local + 0x18) = Send;
    *(code **)(mpi_comm_local + 0x20) = Recv;
    *(code **)(mpi_comm_local + 0x28) = Sendrecv;
    *(code **)(mpi_comm_local + 0x30) = Gather;
    *(code **)(mpi_comm_local + 0x38) = Gatherv;
    *(code **)(mpi_comm_local + 0x40) = Allgather;
    *(code **)(mpi_comm_local + 0x48) = Isend;
    *(code **)(mpi_comm_local + 0x50) = Irecv;
    *(code **)(mpi_comm_local + 0x58) = Waitone;
    *(code **)(mpi_comm_local + 0x60) = Waitany;
    *(code **)(mpi_comm_local + 0x68) = Comm_size;
    *(code **)(mpi_comm_local + 0x70) = Comm_rank;
    pvVar1 = malloc(8);
    *(void **)(mpi_comm_local + 0x78) = pvVar1;
    if (*(long *)(mpi_comm_local + 0x78) == 0) {
      free(mpi_comm_local);
      icetRaiseDiagnostic("Could not allocate memory for IceTCommunicator.",0xfffffffc,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                          ,0xd2);
      mpi_comm_local = (MPI_Comm)0x0;
    }
    else {
      MPI_Comm_dup(mpi_comm,*(undefined8 *)(mpi_comm_local + 0x78));
    }
  }
  return (IceTCommunicator)mpi_comm_local;
}

Assistant:

IceTCommunicator icetCreateMPICommunicator(MPI_Comm mpi_comm)
{
    IceTCommunicator comm = malloc(sizeof(struct IceTCommunicatorStruct));
#ifdef BREAK_ON_MPI_ERROR
    MPI_Errhandler eh;
#endif

    if (comm == NULL) {
        icetRaiseError("Could not allocate memory for IceTCommunicator.",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    comm->Duplicate = Duplicate;
    comm->Destroy = Destroy;
    comm->Barrier = Barrier;
    comm->Send = Send;
    comm->Recv = Recv;
    comm->Sendrecv = Sendrecv;
    comm->Gather = Gather;
    comm->Gatherv = Gatherv;
    comm->Allgather = Allgather;
    comm->Isend = Isend;
    comm->Irecv = Irecv;
    comm->Wait = Waitone;
    comm->Waitany = Waitany;
    comm->Comm_size = Comm_size;
    comm->Comm_rank = Comm_rank;

    comm->data = malloc(sizeof(MPI_Comm));
    if (comm->data == NULL) {
        free(comm);
        icetRaiseError("Could not allocate memory for IceTCommunicator.",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }
    MPI_Comm_dup(mpi_comm, (MPI_Comm *)comm->data);

#ifdef BREAK_ON_MPI_ERROR
    MPI_Errhandler_create(ErrorHandler, &eh);
    MPI_Errhandler_set(*((MPI_Comm *)comm->data), eh);
    MPI_Errhandler_free(&eh);
#endif

    return comm;
}